

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O3

MppTrieNode * mpp_trie_get_node(MppTrieNode *root,char *name)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  MppTrieNode *pMVar6;
  RK_S32 tag_len;
  RK_U64 tag_val;
  RK_S32 local_3c;
  RK_U64 local_38;
  
  local_38 = 0;
  local_3c = 0;
  if (root == (MppTrieNode *)0x0 || name == (char *)0x0) {
    pMVar6 = (MppTrieNode *)0x0;
    _mpp_log_l(2,"mpp_trie","invalid root %p name %p\n","mpp_trie_get_node",root,name);
  }
  else {
    if (((byte)mpp_trie_debug & 4) != 0) {
      _mpp_log_l(4,"mpp_trie","root %p search %s start\n","mpp_trie_get_node",root,name);
    }
    pcVar5 = name + 1;
    uVar3 = 0;
    while( true ) {
      bVar1 = pcVar5[-1];
      cVar2 = *pcVar5;
      uVar3 = mpp_trie_walk(root + uVar3,&local_38,&local_3c,(uint)(bVar1 >> 4));
      if ((int)uVar3 < 0) break;
      uVar3 = mpp_trie_walk(root + uVar3,&local_38,&local_3c,bVar1 & 0xf);
      if (((int)uVar3 < 0) || (pcVar5 = pcVar5 + 1, cVar2 == '\0')) break;
    }
    pMVar6 = (MppTrieNode *)0x0;
    if (-1 < (int)uVar3) {
      pMVar6 = root + uVar3;
    }
    if (((byte)mpp_trie_debug & 4) != 0) {
      if ((int)uVar3 < 0) {
        uVar4 = 0xffffffff;
      }
      else {
        uVar4 = (ulong)(uint)root[uVar3].id;
      }
      _mpp_log_l(4,"mpp_trie","get node %d:%d\n","mpp_trie_get_node",(ulong)uVar3,uVar4);
    }
  }
  return pMVar6;
}

Assistant:

static MppTrieNode *mpp_trie_get_node(MppTrieNode *root, const char *name)
{
    MppTrieNode *ret = NULL;
    const char *s = name;
    RK_U64 tag_val = 0;
    RK_S32 tag_len = 0;
    RK_S32 idx = 0;

    if (!root || !name) {
        mpp_err_f("invalid root %p name %p\n", root, name);
        return NULL;
    }

    trie_dbg_get("root %p search %s start\n", root, name);

    do {
        RK_U8 key = *s++;
        RK_U32 key0 = (key >> 4) & 0xf;
        RK_U32 key1 = key & 0xf;
        RK_S32 end = (s[0] == '\0');

        idx = mpp_trie_walk(&root[idx], &tag_val, &tag_len, key0);
        if (idx < 0)
            break;

        idx = mpp_trie_walk(&root[idx], &tag_val, &tag_len, key1);
        if (idx < 0 || end)
            break;
    } while (1);

    ret = (idx >= 0) ? &root[idx] : NULL;

    trie_dbg_get("get node %d:%d\n", idx, ret ? ret->id : INVALID_NODE_ID);

    return ret;
}